

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClearIniSettings(void)

{
  ImVector<ImGuiSettingsHandler> *this;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *p_Var1;
  ImGuiContext *pIVar2;
  ImGuiSettingsHandler *pIVar3;
  int handler_n;
  int i;
  
  pIVar2 = GImGui;
  ImVector<char>::clear(&(GImGui->SettingsIniData).Buf);
  this = &pIVar2->SettingsHandlers;
  for (i = 0; i < this->Size; i = i + 1) {
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,i);
    if (pIVar3->ClearAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,i);
      p_Var1 = pIVar3->ClearAllFn;
      pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](this,i);
      (*p_Var1)(pIVar2,pIVar3);
    }
  }
  return;
}

Assistant:

void ImGui::ClearIniSettings()
{
    ImGuiContext& g = *GImGui;
    g.SettingsIniData.clear();
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ClearAllFn)
            g.SettingsHandlers[handler_n].ClearAllFn(&g, &g.SettingsHandlers[handler_n]);
}